

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void str_utf8_trim_whitespaces_right(char *str)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long in_FS_OFFSET;
  char *last;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = strlen(str);
  local_30 = str + (int)sVar2;
  do {
    iVar1 = str_utf8_decode(&local_30);
    iVar1 = str_utf8_is_whitespace(iVar1);
    if (iVar1 == 0) break;
    lVar3 = (long)(int)sVar2;
    str[lVar3] = '\0';
    if ((int)sVar2 == 0) break;
    sVar2 = lVar3 - 1;
    local_30 = str + ((lVar3 << 0x20) + -0x100000000 >> 0x20);
  } while (sVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void str_utf8_trim_whitespaces_right(char *str)
{
	int cursor = str_length(str);
	const char *last = str + cursor;
	while(str_utf8_is_whitespace(str_utf8_decode(&last)))
	{
		str[cursor] = 0;
		cursor = str_utf8_rewind(str, cursor);
		last = str + cursor;
		if(cursor == 0)
		{
			break;
		}
	}
}